

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::writeOp<(moira::Core)1,(moira::Mode)3,1,68ull>(Moira *this,int n,u32 val)

{
  u32 addr;
  
  this->writeBuffer = (u16)val;
  addr = computeEA<(moira::Core)1,(moira::Mode)3,1,0ull>(this,n);
  write<(moira::Core)1,(moira::AddrSpace)1,1,68ull>(this,addr,val);
  *(uint *)((long)&(this->reg).field_3 + (long)n * 4 + 0x20) =
       *(int *)((long)&(this->reg).field_3 + (long)n * 4 + 0x20) + (uint)(n == 7) + 1;
  return;
}

Assistant:

void
Moira::writeOp(int n, u32 val)
{
    switch (M) {

        case Mode::DN: writeD<S>(n, val); break;
        case Mode::AN: writeA<S>(n, val); break;
        case Mode::IM: fatalError;

        default:

            writeBuffer = (S == Long) ? u16(val >> 16) : u16(val & 0xFFFF);

            // Compute effective address
            u32 ea = computeEA<C, M, S>(n);

            // Emulate -(An) register modification
            updateAnPD<M, S>(n);

            // Write to effective address
            writeM<C, M, S, F>(ea, val);

            // Emulate (An)+ register modification
            updateAnPI<M, S>(n);
    }
}